

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O0

Data * Data::smaller(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  long lVar1;
  bool bVar2;
  reference ppDVar3;
  reference ppDVar4;
  long local_60;
  long local_48;
  Data *i;
  iterator __end1;
  iterator __begin1;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  Data *result;
  vector<Data_*,_std::allocator<Data_*>_> *dataPara_local;
  
  ppDVar3 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[](dataPara,0);
  if (*ppDVar3 == (value_type)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = __dynamic_cast(*ppDVar3,&typeinfo,&Integer::typeinfo,0);
  }
  lVar1 = *(long *)(local_48 + 0x10);
  ppDVar3 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[](dataPara,1);
  if (*ppDVar3 == (value_type)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(*ppDVar3,&typeinfo,&Integer::typeinfo,0);
  }
  if (lVar1 < *(long *)(local_60 + 0x10)) {
    __range1 = (vector<Data_*,_std::allocator<Data_*>_> *)trueData;
  }
  else {
    __range1 = (vector<Data_*,_std::allocator<Data_*>_> *)falseData;
  }
  __end1 = std::vector<Data_*,_std::allocator<Data_*>_>::begin(dataPara);
  i = (Data *)std::vector<Data_*,_std::allocator<Data_*>_>::end(dataPara);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>
                                *)&i);
    if (!bVar2) break;
    ppDVar4 = __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::
              operator*(&__end1);
    check(*ppDVar4);
    __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::operator++
              (&__end1);
  }
  if (dataPara != (vector<Data_*,_std::allocator<Data_*>_> *)0x0) {
    std::vector<Data_*,_std::allocator<Data_*>_>::~vector(dataPara);
    operator_delete(dataPara);
  }
  return (Data *)__range1;
}

Assistant:

Data *Data::smaller(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    if ((dynamic_cast<Integer *>((*dataPara)[0]))->value
        < (dynamic_cast<Integer *>((*dataPara)[1]))->value) {
        result = Data::trueData;
    } else {
        result = Data::falseData;
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}